

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O0

int envy_bios_parse_inputdev(envy_bios *bios)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  envy_bios_inputdev *peVar6;
  envy_bios_inputdev_entry *peVar7;
  envy_bios_inputdev_entry *entry;
  int i;
  int wantrlen;
  int wanthlen;
  int err;
  envy_bios_inputdev *inputdev;
  envy_bios *bios_local;
  
  peVar6 = &bios->inputdev;
  if (peVar6->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    wantrlen = 0;
    i = 4;
    if ((bios->dcb).version < 0x30) {
      (bios->inputdev).version = (bios->dcb).version;
      (bios->inputdev).hlen = '\0';
      i = 0;
      (bios->inputdev).entriesnum = '\b';
      (bios->inputdev).rlen = '\x01';
    }
    else {
      uVar1 = bios_u8(bios,(uint)peVar6->offset,&(bios->inputdev).version);
      uVar2 = bios_u8(bios,peVar6->offset + 1,&(bios->inputdev).hlen);
      uVar3 = bios_u8(bios,peVar6->offset + 2,&(bios->inputdev).entriesnum);
      uVar4 = bios_u8(bios,peVar6->offset + 3,&(bios->inputdev).rlen);
      wantrlen = uVar4 | uVar3 | uVar2 | uVar1;
    }
    if (wantrlen == 0) {
      envy_bios_block(bios,(uint)peVar6->offset,
                      (uint)(bios->inputdev).hlen +
                      (uint)(bios->inputdev).rlen * (uint)(bios->inputdev).entriesnum,"INPUTDEV",-1)
      ;
      uVar1 = (uint)(bios->inputdev).version;
      if (((uVar1 - 0x20 < 3) || (uVar1 == 0x30)) || (uVar1 == 0x40)) {
        if ((uint)(bios->inputdev).hlen < (uint)i) {
          fprintf(_stderr,"INPUTDEV table header too short [%d < %d]\n",(ulong)(bios->inputdev).hlen
                  ,(ulong)(uint)i);
          bios_local._4_4_ = -0x16;
        }
        else if ((bios->inputdev).rlen == '\0') {
          fprintf(_stderr,"INPUTDEV table record too short [%d < %d]\n",(ulong)(bios->inputdev).rlen
                  ,1);
          bios_local._4_4_ = -0x16;
        }
        else {
          if ((uint)i < (uint)(bios->inputdev).hlen) {
            fprintf(_stderr,"INPUTDEV table header longer than expected [%d > %d]\n",
                    (ulong)(bios->inputdev).hlen,(ulong)(uint)i);
          }
          if (1 < (bios->inputdev).rlen) {
            fprintf(_stderr,"INPUTDEV table record longer than expected [%d > %d]\n",
                    (ulong)(bios->inputdev).rlen,1);
          }
          peVar7 = (envy_bios_inputdev_entry *)calloc((ulong)(bios->inputdev).entriesnum,4);
          (bios->inputdev).entries = peVar7;
          if ((bios->inputdev).entries == (envy_bios_inputdev_entry *)0x0) {
            bios_local._4_4_ = -0xc;
          }
          else {
            for (entry._0_4_ = 0; (int)entry < (int)(uint)(bios->inputdev).entriesnum;
                entry._0_4_ = (int)entry + 1) {
              peVar7 = (bios->inputdev).entries + (int)entry;
              peVar7->offset =
                   peVar6->offset + (ushort)(bios->inputdev).hlen +
                   (ushort)(bios->inputdev).rlen * (short)(int)entry;
              iVar5 = bios_u8(bios,(uint)peVar7->offset,&peVar7->entry);
              if (iVar5 != 0 || wantrlen != 0) {
                return -0xe;
              }
              wantrlen = 0;
            }
            (bios->inputdev).valid = '\x01';
            bios_local._4_4_ = 0;
          }
        }
      }
      else {
        fprintf(_stderr,"Unknown INPUTDEV table version %d.%d\n",
                (ulong)(uint)((int)(uint)(bios->inputdev).version >> 4),
                (ulong)((bios->inputdev).version & 0xf));
        bios_local._4_4_ = -0x16;
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_inputdev (struct envy_bios *bios) {
	struct envy_bios_inputdev *inputdev = &bios->inputdev;
	if (!inputdev->offset)
		return 0;
	int err = 0;
	int wanthlen = 4;
	int wantrlen = 1;
	if (bios->dcb.version >= 0x30) {
		err |= bios_u8(bios, inputdev->offset, &inputdev->version);
		err |= bios_u8(bios, inputdev->offset+1, &inputdev->hlen);
		err |= bios_u8(bios, inputdev->offset+2, &inputdev->entriesnum);
		err |= bios_u8(bios, inputdev->offset+3, &inputdev->rlen);
	} else {
		inputdev->version = bios->dcb.version;
		wanthlen = inputdev->hlen = 0;
		inputdev->entriesnum = 8;
		inputdev->rlen = 1;
	}
	if (err)
		return -EFAULT;
	envy_bios_block(bios, inputdev->offset, inputdev->hlen + inputdev->rlen * inputdev->entriesnum, "INPUTDEV", -1);
	switch (inputdev->version) {
		case 0x20:
		case 0x21:
		case 0x22:
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown INPUTDEV table version %d.%d\n", inputdev->version >> 4, inputdev->version & 0xf);
			return -EINVAL;
	}
	if (inputdev->hlen < wanthlen) {
		ENVY_BIOS_ERR("INPUTDEV table header too short [%d < %d]\n", inputdev->hlen, wanthlen);
		return -EINVAL;
	}
	if (inputdev->rlen < wantrlen) {
		ENVY_BIOS_ERR("INPUTDEV table record too short [%d < %d]\n", inputdev->rlen, wantrlen);
		return -EINVAL;
	}
	if (inputdev->hlen > wanthlen) {
		ENVY_BIOS_WARN("INPUTDEV table header longer than expected [%d > %d]\n", inputdev->hlen, wanthlen);
	}
	if (inputdev->rlen > wantrlen) {
		ENVY_BIOS_WARN("INPUTDEV table record longer than expected [%d > %d]\n", inputdev->rlen, wantrlen);
	}
	inputdev->entries = calloc(inputdev->entriesnum, sizeof *inputdev->entries);
	if (!inputdev->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < inputdev->entriesnum; i++) {
		struct envy_bios_inputdev_entry *entry = &inputdev->entries[i];
		entry->offset = inputdev->offset + inputdev->hlen + inputdev->rlen * i;
		err |= bios_u8(bios, entry->offset, &entry->entry);
		if (err)
			return -EFAULT;
	}
	inputdev->valid = 1;
	return 0;
}